

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  size_t sVar2;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  ZSTD_CStream *zcs_local;
  ZSTD_frameParameters fParams_local;
  
  fParams_local._4_8_ = ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar1 = ERR_isError(fParams_local._4_8_);
  if (uVar1 == 0) {
    fParams_local._4_8_ = ZSTD_CCtx_setPledgedSrcSize(zcs,pledgedSrcSize);
    uVar1 = ERR_isError(fParams_local._4_8_);
    if (uVar1 == 0) {
      (zcs->requestedParams).fParams.contentSizeFlag = (int)fParams._0_8_;
      (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)fParams._0_8_ >> 0x20);
      (zcs->requestedParams).fParams.noDictIDFlag = fParams.noDictIDFlag;
      fParams_local._4_8_ = ZSTD_CCtx_refCDict(zcs,cdict);
      uVar1 = ERR_isError(fParams_local._4_8_);
      if (uVar1 == 0) {
        fParams_local.checksumFlag = 0;
        fParams_local.noDictIDFlag = 0;
      }
    }
  }
  sVar2._0_4_ = fParams_local.checksumFlag;
  sVar2._4_4_ = fParams_local.noDictIDFlag;
  return sVar2;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) );
    zcs->requestedParams.fParams = fParams;
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) );
    return 0;
}